

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.cpp
# Opt level: O1

string * cappuccino::to_string_abi_cxx11_(thread_safe ts)

{
  string *psVar1;
  undefined1 *puVar2;
  
  puVar2 = thread_safe_invalid_value_abi_cxx11_;
  if (ts == yes) {
    puVar2 = thread_safe_yes_abi_cxx11_;
  }
  psVar1 = (string *)thread_safe_no_abi_cxx11_;
  if (ts != no) {
    psVar1 = (string *)puVar2;
  }
  return psVar1;
}

Assistant:

auto to_string(thread_safe ts) -> const std::string&
{
    switch (ts)
    {
        case thread_safe::no:
            return thread_safe_no;
        case thread_safe::yes:
            return thread_safe_yes;
        default:
            return thread_safe_invalid_value;
    }
}